

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

int secp256k1_wnaf_fixed(int *wnaf,secp256k1_scalar *s,int w)

{
  uint count;
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint offset;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  iVar1 = secp256k1_scalar_is_zero(s);
  if (iVar1 == 0) {
    uVar9 = ~(uint)s->d[0] & 1;
    uVar2 = secp256k1_scalar_get_bits_var(s,0,w);
    *wnaf = uVar2 + uVar9;
    uVar8 = (uint)(0x7f / (long)w);
    uVar7 = 0x7f / (long)w & 0xffffffff;
    offset = uVar8 * w;
    uVar3 = 0x80 - offset;
    uVar4 = (int)uVar8 >> 0x1f & uVar8;
    lVar6 = 0;
    while (0 < (int)(uVar8 + (int)lVar6)) {
      count = w;
      if (lVar6 == 0) {
        count = uVar3;
      }
      uVar2 = secp256k1_scalar_get_bits_var(s,offset,count);
      if (uVar2 != 0) {
        uVar4 = (int)lVar6 + uVar8;
        break;
      }
      wnaf[uVar7 + lVar6] = 0;
      offset = offset - w;
      lVar6 = lVar6 + -1;
    }
    iVar1 = -1 << ((byte)w & 0x1f);
    uVar11 = 0;
    if (0 < (int)uVar4) {
      uVar11 = (ulong)uVar4;
    }
    uVar8 = w;
    for (uVar10 = 1; uVar10 - uVar11 != 1; uVar10 = uVar10 + 1) {
      uVar4 = w;
      if (uVar7 == uVar10) {
        uVar4 = uVar3;
      }
      uVar2 = secp256k1_scalar_get_bits_var(s,uVar8,uVar4);
      if ((uVar2 & 1) == 0) {
        wnaf[uVar10 - 1] = wnaf[uVar10 - 1] + iVar1;
        uVar2 = uVar2 | 1;
      }
      wnaf[uVar10] = uVar2;
      if (1 < uVar10) {
        if (wnaf[uVar10 - 1] == -1) {
          if (0 < wnaf[uVar10 - 2]) {
            iVar5 = wnaf[uVar10 - 2] + iVar1;
            goto LAB_00131674;
          }
        }
        else if ((wnaf[uVar10 - 1] == 1) && (wnaf[uVar10 - 2] < 0)) {
          iVar5 = wnaf[uVar10 - 2] + (1 << ((byte)w & 0x1f));
LAB_00131674:
          wnaf[uVar10 - 2] = iVar5;
          wnaf[uVar10 - 1] = 0;
        }
      }
      uVar8 = uVar8 + w;
    }
  }
  else {
    uVar9 = 0;
    for (lVar6 = 0; lVar6 <= (int)(0x7f / (long)w); lVar6 = lVar6 + 1) {
      wnaf[lVar6] = 0;
    }
  }
  return uVar9;
}

Assistant:

static int secp256k1_wnaf_fixed(int *wnaf, const secp256k1_scalar *s, int w) {
    int skew = 0;
    int pos;
    int max_pos;
    int last_w;
    const secp256k1_scalar *work = s;

    if (secp256k1_scalar_is_zero(s)) {
        for (pos = 0; pos < WNAF_SIZE(w); pos++) {
            wnaf[pos] = 0;
        }
        return 0;
    }

    if (secp256k1_scalar_is_even(s)) {
        skew = 1;
    }

    wnaf[0] = secp256k1_scalar_get_bits_var(work, 0, w) + skew;
    /* Compute last window size. Relevant when window size doesn't divide the
     * number of bits in the scalar */
    last_w = WNAF_BITS - (WNAF_SIZE(w) - 1) * w;

    /* Store the position of the first nonzero word in max_pos to allow
     * skipping leading zeros when calculating the wnaf. */
    for (pos = WNAF_SIZE(w) - 1; pos > 0; pos--) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if(val != 0) {
            break;
        }
        wnaf[pos] = 0;
    }
    max_pos = pos;
    pos = 1;

    while (pos <= max_pos) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if ((val & 1) == 0) {
            wnaf[pos - 1] -= (1 << w);
            wnaf[pos] = (val + 1);
        } else {
            wnaf[pos] = val;
        }
        /* Set a coefficient to zero if it is 1 or -1 and the proceeding digit
         * is strictly negative or strictly positive respectively. Only change
         * coefficients at previous positions because above code assumes that
         * wnaf[pos - 1] is odd.
         */
        if (pos >= 2 && ((wnaf[pos - 1] == 1 && wnaf[pos - 2] < 0) || (wnaf[pos - 1] == -1 && wnaf[pos - 2] > 0))) {
            if (wnaf[pos - 1] == 1) {
                wnaf[pos - 2] += 1 << w;
            } else {
                wnaf[pos - 2] -= 1 << w;
            }
            wnaf[pos - 1] = 0;
        }
        ++pos;
    }

    return skew;
}